

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<4,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  uint uVar4;
  RTCFormat RVar5;
  uint uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  iterator __position;
  InstanceArray *pIVar8;
  RawBufferView *pRVar9;
  char *pcVar10;
  undefined8 *puVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  Accel *pAVar20;
  long lVar21;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar41;
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar51 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 in_ZMM11 [64];
  undefined1 auVar71 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined1 local_c8;
  ThreadLocal2 *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ThreadLocal2 *local_98;
  char local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  
  auVar71 = in_ZMM12._0_16_;
  auVar57 = in_ZMM11._0_16_;
  auVar51 = in_ZMM7._0_16_;
  auVar24 = in_ZMM6._0_16_;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = __return_storage_ptr__;
  uVar3 = current->_begin;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = current;
  uVar4 = current->_end;
  uVar14 = (ulong)(uVar4 - uVar3);
  local_d8 = (undefined8 *)(uVar14 * 8);
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_90 = '\x01';
    local_98 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar23 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_01->alloc0).end = auVar23._0_8_;
    (this_01->alloc0).allocBlockSize = auVar23._8_8_;
    (this_01->alloc0).bytesUsed = auVar23._16_8_;
    (this_01->alloc0).bytesWasted = auVar23._24_8_;
    (this_01->alloc0).ptr = (char *)auVar23._0_8_;
    (this_01->alloc0).cur = auVar23._8_8_;
    (this_01->alloc0).end = auVar23._16_8_;
    (this_01->alloc0).allocBlockSize = auVar23._24_8_;
    auVar23 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = auVar23._0_8_;
      (this_01->alloc1).allocBlockSize = auVar23._8_8_;
      (this_01->alloc1).bytesUsed = auVar23._16_8_;
      (this_01->alloc1).bytesWasted = auVar23._24_8_;
      (this_01->alloc1).ptr = (char *)auVar23._0_8_;
      (this_01->alloc1).cur = auVar23._8_8_;
      (this_01->alloc1).end = auVar23._16_8_;
      (this_01->alloc1).allocBlockSize = auVar23._24_8_;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)auVar23._0_8_;
      (this_01->alloc1).cur = auVar23._8_8_;
      (this_01->alloc1).end = auVar23._16_8_;
      (this_01->alloc1).allocBlockSize = auVar23._24_8_;
      (this_01->alloc1).end = auVar23._0_8_;
      (this_01->alloc1).allocBlockSize = auVar23._8_8_;
      (this_01->alloc1).bytesUsed = auVar23._16_8_;
      (this_01->alloc1).bytesWasted = auVar23._24_8_;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_d0 = &FastAllocator::s_thread_local_allocators_lock;
    local_c8 = 1;
    in_ZMM6 = ZEXT1664(auVar24);
    in_ZMM7 = ZEXT1664(auVar51);
    in_ZMM11 = ZEXT1664(auVar57);
    in_ZMM12 = ZEXT1664(auVar71);
    local_c0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_c0);
    }
    else {
      *__position._M_current = local_c0;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_90 == '\x01') {
      MutexSys::unlock(&local_98->mutex);
    }
  }
  puVar13 = local_d8;
  pTVar7->bytesUsed = pTVar7->bytesUsed + (long)local_d8;
  sVar17 = pTVar7->cur;
  uVar18 = (ulong)(-(int)sVar17 & 0xf);
  uVar15 = (long)local_d8 + uVar18 + sVar17;
  pTVar7->cur = uVar15;
  if (pTVar7->end < uVar15) {
    pTVar7->cur = sVar17;
    puVar11 = (undefined8 *)pTVar7->allocBlockSize;
    if ((undefined8 *)((long)local_d8 * 4) < puVar11 || (long)local_d8 * 4 - (long)puVar11 == 0) {
      local_d0 = puVar11;
      pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d0);
      pTVar7->ptr = pcVar16;
      sVar17 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar17;
      pTVar7->end = (size_t)local_d0;
      pTVar7->cur = (size_t)puVar13;
      if (local_d0 < puVar13) {
        pTVar7->cur = 0;
        local_d0 = (undefined8 *)pTVar7->allocBlockSize;
        pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d0);
        pTVar7->ptr = pcVar16;
        sVar17 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar17;
        pTVar7->end = (size_t)local_d0;
        pTVar7->cur = (size_t)puVar13;
        if (local_d0 < puVar13) {
          pTVar7->cur = 0;
          pcVar16 = (char *)0x0;
          goto LAB_01498c11;
        }
      }
      pTVar7->bytesWasted = sVar17;
    }
    else {
      pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d8);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar18;
    pcVar16 = pTVar7->ptr + (uVar15 - (long)local_d8);
  }
LAB_01498c11:
  if (uVar4 == uVar3) {
    auVar24._8_4_ = 0x7f800000;
    auVar24._0_8_ = 0x7f8000007f800000;
    auVar24._12_4_ = 0x7f800000;
    aVar22.m128[2] = -INFINITY;
    aVar22._0_8_ = 0xff800000ff800000;
    aVar22.m128[3] = -INFINITY;
  }
  else {
    pIVar8 = this->mesh;
    aVar22.m128[2] = -INFINITY;
    aVar22._0_8_ = 0xff800000ff800000;
    aVar22.m128[3] = -INFINITY;
    auVar24._8_4_ = 0x7f800000;
    auVar24._0_8_ = 0x7f8000007f800000;
    auVar24._12_4_ = 0x7f800000;
    lVar19 = 0;
    do {
      uVar4 = this->morton[(ulong)uVar3 + lVar19].field_0.field_0.index;
      uVar15 = (ulong)uVar4;
      pAVar20 = *(Accel **)&(pIVar8->super_Geometry).field_0x58;
      auVar51 = in_ZMM7._0_16_;
      if ((pAVar20 != (Accel *)0x0) ||
         (*(int *)((pIVar8->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar8->object_ids).super_RawBufferView.stride * uVar15) != -1)) {
        pRVar9 = (pIVar8->l2w_buf).items;
        RVar5 = pRVar9->format;
        if ((pIVar8->super_Geometry).field_8.field_0x1 == '\x01') {
          if ((int)RVar5 < 0x9244) {
            if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar21 = pRVar9->stride * uVar15;
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x10)),0x1c);
              local_a8 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x20)),0x28);
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 4)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x14)),0x1c);
              local_78 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x24)),0x28);
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 8)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),0x1c);
              local_b8 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x28)),0x28);
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x1c)),0x1c);
              local_68 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x2c)),0x28);
            }
            else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar21 = pRVar9->stride * uVar15;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)(pcVar10 + lVar21 + 4);
              auVar51 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),auVar53,0x4c);
              local_a8 = vshufps_avx(auVar51,auVar51,0x78);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x10);
              auVar51 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),auVar54,0x4c);
              local_78 = vshufps_avx(auVar51,auVar51,0x78);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x1c);
              auVar51 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),auVar55,0x4c);
              local_b8 = vshufps_avx(auVar51,auVar51,0x78);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x28);
              auVar51 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x24)),auVar56,0x4c);
              local_68 = vshufps_avx(auVar51,auVar51,0x78);
            }
          }
          else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar21 = pRVar9->stride * uVar15;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x10);
            auVar51 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(pcVar10 + lVar21 + 8)),0x20);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x34);
            auVar57 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),auVar71);
            auVar71 = vshufps_avx(auVar57,auVar71,0xd8);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x1c);
            auVar57 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),auVar75);
            auVar75 = vshufps_avx(auVar57,auVar75,0xd8);
            fVar25 = *(float *)(pcVar10 + lVar21 + 0x24);
            fVar27 = *(float *)(pcVar10 + lVar21 + 0x28);
            fVar28 = *(float *)(pcVar10 + lVar21 + 0x2c);
            fVar29 = *(float *)(pcVar10 + lVar21 + 0x30);
            fVar34 = fVar29 * fVar29 + fVar28 * fVar28 + fVar25 * fVar25 + fVar27 * fVar27;
            auVar57 = vrsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
            fVar41 = auVar57._0_4_;
            fVar34 = fVar41 * 1.5 + fVar41 * fVar41 * fVar41 * fVar34 * -0.5;
            local_68 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar25 * fVar34)),0x30);
            local_a8 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar27 * fVar34)),0x30);
            auVar57 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar10 + lVar21 + 4)),0x10);
            local_b8 = vinsertps_avx(auVar51,ZEXT416((uint)(fVar34 * fVar29)),0x30);
            auVar51 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x3c)),0x20);
            local_78 = vinsertps_avx(auVar51,ZEXT416((uint)(fVar28 * fVar34)),0x30);
          }
          else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar21 = pRVar9->stride * uVar15;
            local_a8 = *(undefined1 (*) [16])(pcVar10 + lVar21);
            local_78 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x10);
            local_b8 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x20);
            local_68 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x30);
          }
          auVar51 = vshufps_avx(local_68,local_68,0xff);
          auVar57 = vshufps_avx(local_a8,local_a8,0xff);
          auVar71 = vshufps_avx(local_78,local_78,0xff);
          auVar75 = vshufps_avx(local_b8,local_b8,0xff);
          fVar44 = auVar57._0_4_;
          fVar43 = auVar51._0_4_;
          fVar70 = auVar71._0_4_;
          fVar47 = auVar75._0_4_;
          fVar25 = fVar47 * fVar43 + fVar44 * fVar70;
          fVar29 = fVar44 * fVar70 - fVar47 * fVar43;
          fVar34 = fVar43 * fVar43 - fVar44 * fVar44;
          fVar41 = fVar44 * fVar47 - fVar70 * fVar43;
          fVar27 = fVar44 * fVar47 + fVar70 * fVar43;
          fVar28 = fVar70 * fVar47 + fVar44 * fVar43;
          fVar42 = fVar70 * fVar47 - fVar44 * fVar43;
          auVar51 = ZEXT416((uint)(fVar25 + fVar25));
          auVar51 = vshufps_avx(auVar51,auVar51,0);
          auVar57 = ZEXT416((uint)(fVar41 + fVar41));
          auVar57 = vshufps_avx(auVar57,auVar57,0);
          auVar71 = vpermilps_avx(ZEXT416((uint)(-fVar47 * fVar47 +
                                                -fVar70 * fVar70 + fVar43 * fVar43 + fVar44 * fVar44
                                                )),0);
          fVar68 = auVar71._0_4_ * 1.0 + auVar51._0_4_ * 0.0 + auVar57._0_4_ * 0.0;
          fVar48 = auVar71._4_4_ * 0.0 + auVar51._4_4_ * 1.0 + auVar57._4_4_ * 0.0;
          fVar69 = auVar71._8_4_ * 0.0 + auVar51._8_4_ * 0.0 + auVar57._8_4_ * 1.0;
          fVar49 = auVar71._12_4_ * 0.0 + auVar51._12_4_ * 0.0 + auVar57._12_4_ * 0.0;
          auVar51 = ZEXT416((uint)(fVar29 + fVar29));
          auVar51 = vshufps_avx(auVar51,auVar51,0);
          auVar71 = vpermilps_avx(ZEXT416((uint)(fVar70 * fVar70 + fVar34 + -fVar47 * fVar47)),0);
          auVar57 = ZEXT416((uint)(fVar28 + fVar28));
          auVar57 = vshufps_avx(auVar57,auVar57,0);
          fVar41 = auVar51._0_4_ * 1.0 + auVar57._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
          fVar43 = auVar51._4_4_ * 0.0 + auVar57._4_4_ * 0.0 + auVar71._4_4_ * 1.0;
          fVar44 = auVar51._8_4_ * 0.0 + auVar57._8_4_ * 1.0 + auVar71._8_4_ * 0.0;
          fVar67 = auVar51._12_4_ * 0.0 + auVar57._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
          auVar51 = ZEXT416((uint)(fVar27 + fVar27));
          auVar51 = vshufps_avx(auVar51,auVar51,0);
          auVar57 = ZEXT416((uint)(fVar42 + fVar42));
          auVar57 = vshufps_avx(auVar57,auVar57,0);
          auVar71 = vpermilps_avx(ZEXT416((uint)(fVar47 * fVar47 + fVar34 + -fVar70 * fVar70)),0);
          fVar25 = auVar57._0_4_ * 0.0 + auVar71._0_4_ * 0.0 + auVar51._0_4_ * 1.0;
          fVar27 = auVar57._4_4_ * 1.0 + auVar71._4_4_ * 0.0 + auVar51._4_4_ * 0.0;
          fVar28 = auVar57._8_4_ * 0.0 + auVar71._8_4_ * 1.0 + auVar51._8_4_ * 0.0;
          fVar29 = auVar57._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar51._12_4_ * 0.0;
          auVar57 = vshufps_avx(local_a8,local_a8,0);
          auVar51._0_4_ = auVar57._0_4_ * fVar68 + fVar41 * 0.0 + fVar25 * 0.0;
          auVar51._4_4_ = auVar57._4_4_ * fVar48 + fVar43 * 0.0 + fVar27 * 0.0;
          auVar51._8_4_ = auVar57._8_4_ * fVar69 + fVar44 * 0.0 + fVar28 * 0.0;
          auVar51._12_4_ = auVar57._12_4_ * fVar49 + fVar67 * 0.0 + fVar29 * 0.0;
          auVar57 = vshufps_avx(local_78,local_78,0);
          auVar71 = vshufps_avx(local_78,local_78,0x55);
          auVar50._0_4_ = auVar57._0_4_ * fVar68 + auVar71._0_4_ * fVar41 + fVar25 * 0.0;
          auVar50._4_4_ = auVar57._4_4_ * fVar48 + auVar71._4_4_ * fVar43 + fVar27 * 0.0;
          auVar50._8_4_ = auVar57._8_4_ * fVar69 + auVar71._8_4_ * fVar44 + fVar28 * 0.0;
          auVar50._12_4_ = auVar57._12_4_ * fVar49 + auVar71._12_4_ * fVar67 + fVar29 * 0.0;
          auVar57 = vshufps_avx(local_b8,local_b8,0x55);
          auVar71 = vshufps_avx(local_b8,local_b8,0xaa);
          auVar75 = vshufps_avx(local_b8,local_b8,0);
          auVar76._0_4_ = auVar75._0_4_ * fVar68 + auVar57._0_4_ * fVar41 + auVar71._0_4_ * fVar25;
          auVar76._4_4_ = auVar75._4_4_ * fVar48 + auVar57._4_4_ * fVar43 + auVar71._4_4_ * fVar27;
          auVar76._8_4_ = auVar75._8_4_ * fVar69 + auVar57._8_4_ * fVar44 + auVar71._8_4_ * fVar28;
          auVar76._12_4_ =
               auVar75._12_4_ * fVar49 + auVar57._12_4_ * fVar67 + auVar71._12_4_ * fVar29;
          auVar71 = vshufps_avx(local_68,local_68,0xaa);
          auVar75 = vshufps_avx(local_68,local_68,0x55);
          auVar53 = vshufps_avx(local_68,local_68,0);
          auVar57 = vshufps_avx(local_a8,ZEXT816(0) << 0x20,0xe9);
          auVar57 = vblendps_avx(auVar57,local_78,4);
          auVar74._0_4_ =
               auVar57._0_4_ + 0.0 +
               auVar53._0_4_ * fVar68 + auVar75._0_4_ * fVar41 + auVar71._0_4_ * fVar25;
          auVar74._4_4_ =
               auVar57._4_4_ + 0.0 +
               auVar53._4_4_ * fVar48 + auVar75._4_4_ * fVar43 + auVar71._4_4_ * fVar27;
          auVar74._8_4_ =
               auVar57._8_4_ + 0.0 +
               auVar53._8_4_ * fVar69 + auVar75._8_4_ * fVar44 + auVar71._8_4_ * fVar28;
          auVar74._12_4_ =
               auVar57._12_4_ + 0.0 +
               auVar53._12_4_ * fVar49 + auVar75._12_4_ * fVar67 + auVar71._12_4_ * fVar29;
        }
        else {
          auVar50 = in_ZMM6._0_16_;
          auVar76 = local_108;
          auVar74 = local_f8;
          if ((int)RVar5 < 0x9244) {
            if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar21 = pRVar9->stride * uVar15;
              auVar51 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x10)),0x1c);
              auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x20)),0x28);
              auVar57 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 4)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x14)),0x1c);
              auVar50 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x24)),0x28);
              auVar57 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 8)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),0x1c);
              auVar76 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x28)),0x28);
              auVar57 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x1c)),0x1c);
              auVar74 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x2c)),0x28);
            }
            else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar21 = pRVar9->stride * uVar15;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)(pcVar10 + lVar21 + 4);
              auVar51 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),auVar35,0x4c);
              auVar51 = vshufps_avx(auVar51,auVar51,0x78);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x10);
              auVar57 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),auVar36,0x4c);
              auVar50 = vshufps_avx(auVar57,auVar57,0x78);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x1c);
              auVar57 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),auVar37,0x4c);
              auVar76 = vshufps_avx(auVar57,auVar57,0x78);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x28);
              auVar57 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x24)),auVar38,0x4c);
              auVar74 = vshufps_avx(auVar57,auVar57,0x78);
            }
          }
          else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar21 = pRVar9->stride * uVar15;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x10);
            auVar57 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(pcVar10 + lVar21 + 8)),0x20);
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x34);
            auVar51 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21)),auVar40);
            auVar71 = vshufps_avx(auVar51,auVar40,0xd8);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *(ulong *)(pcVar10 + lVar21 + 0x1c);
            auVar51 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x18)),auVar52);
            auVar75 = vshufps_avx(auVar51,auVar52,0xd8);
            fVar25 = *(float *)(pcVar10 + lVar21 + 0x24);
            fVar27 = *(float *)(pcVar10 + lVar21 + 0x28);
            fVar28 = *(float *)(pcVar10 + lVar21 + 0x2c);
            fVar29 = *(float *)(pcVar10 + lVar21 + 0x30);
            fVar34 = fVar29 * fVar29 + fVar28 * fVar28 + fVar25 * fVar25 + fVar27 * fVar27;
            auVar51 = vrsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
            fVar41 = auVar51._0_4_;
            fVar34 = fVar41 * 1.5 + fVar41 * fVar41 * fVar41 * fVar34 * -0.5;
            auVar74 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar25 * fVar34)),0x30);
            auVar51 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar27 * fVar34)),0x30);
            auVar71 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar21 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar10 + lVar21 + 4)),0x10);
            auVar76 = vinsertps_avx(auVar57,ZEXT416((uint)(fVar29 * fVar34)),0x30);
            auVar57 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(pcVar10 + lVar21 + 0x3c)),0x20);
            auVar50 = vinsertps_avx(auVar57,ZEXT416((uint)(fVar28 * fVar34)),0x30);
          }
          else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar21 = pRVar9->stride * uVar15;
            auVar51 = *(undefined1 (*) [16])(pcVar10 + lVar21);
            auVar50 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x10);
            auVar76 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x20);
            auVar74 = *(undefined1 (*) [16])(pcVar10 + lVar21 + 0x30);
          }
          in_ZMM6 = ZEXT1664(auVar50);
          in_ZMM7 = ZEXT1664(auVar51);
          local_108 = auVar76;
          local_f8 = auVar74;
        }
        if (pAVar20 == (Accel *)0x0) {
          pAVar20 = pIVar8->objects
                    [*(uint *)((pIVar8->object_ids).super_RawBufferView.ptr_ofs +
                              (pIVar8->object_ids).super_RawBufferView.stride * uVar15)];
        }
        auVar71 = vminps_avx((undefined1  [16])
                             (pAVar20->super_AccelData).bounds.bounds0.lower.field_0,
                             (undefined1  [16])
                             (pAVar20->super_AccelData).bounds.bounds1.lower.field_0);
        auVar57 = vmaxps_avx((undefined1  [16])
                             (pAVar20->super_AccelData).bounds.bounds0.upper.field_0,
                             (undefined1  [16])
                             (pAVar20->super_AccelData).bounds.bounds1.upper.field_0);
        auVar75 = vshufps_avx(auVar71,auVar71,0);
        auVar53 = vshufps_avx(auVar71,auVar71,0x55);
        auVar71 = vshufps_avx(auVar71,auVar71,0xaa);
        fVar34 = auVar74._0_4_ + auVar76._0_4_ * auVar71._0_4_;
        fVar41 = auVar74._4_4_ + auVar76._4_4_ * auVar71._4_4_;
        fVar42 = auVar74._8_4_ + auVar76._8_4_ * auVar71._8_4_;
        fVar43 = auVar74._12_4_ + auVar76._12_4_ * auVar71._12_4_;
        fVar63 = auVar50._0_4_ * auVar53._0_4_;
        fVar64 = auVar50._4_4_ * auVar53._4_4_;
        fVar65 = auVar50._8_4_ * auVar53._8_4_;
        fVar66 = auVar50._12_4_ * auVar53._12_4_;
        fVar25 = fVar63 + fVar34;
        fVar27 = fVar64 + fVar41;
        fVar28 = fVar65 + fVar42;
        fVar29 = fVar66 + fVar43;
        fVar58 = auVar51._0_4_ * auVar75._0_4_;
        fVar60 = auVar51._4_4_ * auVar75._4_4_;
        fVar61 = auVar51._8_4_ * auVar75._8_4_;
        fVar62 = auVar51._12_4_ * auVar75._12_4_;
        auVar30._0_4_ = fVar58 + fVar25;
        auVar30._4_4_ = fVar60 + fVar27;
        auVar30._8_4_ = fVar61 + fVar28;
        auVar30._12_4_ = fVar62 + fVar29;
        auVar45._8_4_ = 0x7f800000;
        auVar45._0_8_ = 0x7f8000007f800000;
        auVar45._12_4_ = 0x7f800000;
        auVar75 = vminps_avx(auVar45,auVar30);
        auVar46._8_4_ = 0xff800000;
        auVar46._0_8_ = 0xff800000ff800000;
        auVar46._12_4_ = 0xff800000;
        auVar71 = vmaxps_avx(auVar46,auVar30);
        auVar53 = vshufps_avx(auVar57,auVar57,0xaa);
        fVar44 = auVar74._0_4_ + auVar76._0_4_ * auVar53._0_4_;
        fVar47 = auVar74._4_4_ + auVar76._4_4_ * auVar53._4_4_;
        fVar48 = auVar74._8_4_ + auVar76._8_4_ * auVar53._8_4_;
        fVar49 = auVar74._12_4_ + auVar76._12_4_ * auVar53._12_4_;
        fVar63 = fVar63 + fVar44;
        fVar64 = fVar64 + fVar47;
        fVar65 = fVar65 + fVar48;
        fVar66 = fVar66 + fVar49;
        auVar72._0_4_ = fVar58 + fVar63;
        auVar72._4_4_ = fVar60 + fVar64;
        auVar72._8_4_ = fVar61 + fVar65;
        auVar72._12_4_ = fVar62 + fVar66;
        auVar75 = vminps_avx(auVar75,auVar72);
        auVar71 = vmaxps_avx(auVar71,auVar72);
        auVar53 = vshufps_avx(auVar57,auVar57,0x55);
        fVar67 = auVar50._0_4_ * auVar53._0_4_;
        fVar68 = auVar50._4_4_ * auVar53._4_4_;
        fVar69 = auVar50._8_4_ * auVar53._8_4_;
        fVar70 = auVar50._12_4_ * auVar53._12_4_;
        fVar34 = fVar67 + fVar34;
        fVar41 = fVar68 + fVar41;
        fVar42 = fVar69 + fVar42;
        fVar43 = fVar70 + fVar43;
        auVar73._0_4_ = fVar58 + fVar34;
        auVar73._4_4_ = fVar60 + fVar41;
        auVar73._8_4_ = fVar61 + fVar42;
        auVar73._12_4_ = fVar62 + fVar43;
        auVar75 = vminps_avx(auVar75,auVar73);
        auVar71 = vmaxps_avx(auVar71,auVar73);
        fVar67 = fVar67 + fVar44;
        fVar68 = fVar68 + fVar47;
        fVar69 = fVar69 + fVar48;
        fVar70 = fVar70 + fVar49;
        auVar59._0_4_ = fVar58 + fVar67;
        auVar59._4_4_ = fVar60 + fVar68;
        auVar59._8_4_ = fVar61 + fVar69;
        auVar59._12_4_ = fVar62 + fVar70;
        auVar75 = vminps_avx(auVar75,auVar59);
        auVar71 = vmaxps_avx(auVar71,auVar59);
        auVar57 = vshufps_avx(auVar57,auVar57,0);
        fVar44 = auVar51._0_4_ * auVar57._0_4_;
        fVar47 = auVar51._4_4_ * auVar57._4_4_;
        fVar48 = auVar51._8_4_ * auVar57._8_4_;
        fVar49 = auVar51._12_4_ * auVar57._12_4_;
        auVar26._0_4_ = fVar44 + fVar25;
        auVar26._4_4_ = fVar47 + fVar27;
        auVar26._8_4_ = fVar48 + fVar28;
        auVar26._12_4_ = fVar49 + fVar29;
        auVar57 = vminps_avx(auVar75,auVar26);
        auVar51 = vmaxps_avx(auVar71,auVar26);
        auVar31._0_4_ = fVar44 + fVar63;
        auVar31._4_4_ = fVar47 + fVar64;
        auVar31._8_4_ = fVar48 + fVar65;
        auVar31._12_4_ = fVar49 + fVar66;
        auVar57 = vminps_avx(auVar57,auVar31);
        auVar51 = vmaxps_avx(auVar51,auVar31);
        auVar32._0_4_ = fVar44 + fVar34;
        auVar32._4_4_ = fVar47 + fVar41;
        auVar32._8_4_ = fVar48 + fVar42;
        auVar32._12_4_ = fVar49 + fVar43;
        auVar57 = vminps_avx(auVar57,auVar32);
        auVar51 = vmaxps_avx(auVar51,auVar32);
        auVar33._0_4_ = fVar44 + fVar67;
        auVar33._4_4_ = fVar47 + fVar68;
        auVar33._8_4_ = fVar48 + fVar69;
        auVar33._12_4_ = fVar49 + fVar70;
        auVar57 = vminps_avx(auVar57,auVar33);
        in_ZMM11 = ZEXT1664(auVar57);
        auVar51 = vmaxps_avx(auVar51,auVar33);
        in_ZMM12 = ZEXT1664(auVar51);
      }
      auVar24 = vminps_avx(auVar24,in_ZMM11._0_16_);
      aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,in_ZMM12._0_16_);
      uVar6 = this->geomID_;
      *(uint *)(pcVar16 + lVar19 * 8) = uVar4;
      *(uint *)(pcVar16 + lVar19 * 8 + 4) = uVar6;
      lVar19 = lVar19 + 1;
    } while (uVar14 + (uVar14 == 0) != lVar19);
  }
  uVar15 = 7;
  if (uVar14 < 7) {
    uVar15 = uVar14;
  }
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
           vinsertps_avx(auVar24,ZEXT416(current->_end - current->_begin),0x30);
  (__return_storage_ptr__->ref).ptr = uVar15 | (ulong)pcVar16 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar12;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar22;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }